

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QString * QJsonValueConstRef::objectKey(QJsonValueConstRef self)

{
  long lVar1;
  QJsonValueConstRef r;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_RDX;
  undefined8 extraout_RDX;
  QCborContainerPrivate *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QJsonValueConstRef r_00;
  qsizetype index;
  QCborContainerPrivate *d;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_stack_ffffffffffffff98;
  QCborContainerPrivate *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r._8_8_ = in_RDI;
  r.field_0.d = in_stack_ffffffffffffff98.d;
  this = in_RSI;
  QJsonPrivate::Value::container(r);
  r_00._8_8_ = extraout_RDX;
  r_00.field_0.d = in_RDX.d;
  QJsonPrivate::Value::indexHelper((Value *)in_RSI,r_00);
  QCborContainerPrivate::stringAt(this,(qsizetype)in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QJsonValueConstRef::objectKey(QJsonValueConstRef self)
{
    Q_ASSERT(self.is_object);
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);

    Q_ASSERT(d);
    Q_ASSERT(index < d->elements.size());
    return d->stringAt(index - 1);
}